

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86.cpp
# Opt level: O2

int __thiscall ncnn::TanH_x86::forward_inplace(TanH_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar10;
  }
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pfVar5 = (float *)(sVar3 * uVar10 * sVar2 + (long)pvVar1);
    lVar8 = 0;
    for (iVar7 = 0; iVar7 + 3 < iVar6; iVar7 = iVar7 + 4) {
      auVar19._0_4_ = *pfVar5 * -2.0;
      auVar19._4_4_ = pfVar5[1] * -2.0;
      auVar19._8_4_ = pfVar5[2] * -2.0;
      auVar19._12_4_ = pfVar5[3] * -2.0;
      auVar20 = minps(auVar19,_DAT_00538670);
      auVar20 = maxps(auVar20,_DAT_00538680);
      fVar15 = auVar20._0_4_ * 1.442695 + 0.5;
      fVar16 = auVar20._4_4_ * 1.442695 + 0.5;
      fVar17 = auVar20._8_4_ * 1.442695 + 0.5;
      fVar18 = auVar20._12_4_ * 1.442695 + 0.5;
      fVar11 = (float)(int)fVar15;
      fVar12 = (float)(int)fVar16;
      fVar13 = (float)(int)fVar17;
      fVar14 = (float)(int)fVar18;
      fVar11 = fVar11 - (float)(-(uint)(fVar15 < fVar11) & 0x3f800000);
      fVar12 = fVar12 - (float)(-(uint)(fVar16 < fVar12) & 0x3f800000);
      fVar13 = fVar13 - (float)(-(uint)(fVar17 < fVar13) & 0x3f800000);
      fVar14 = fVar14 - (float)(-(uint)(fVar18 < fVar14) & 0x3f800000);
      fVar15 = fVar11 * -0.6931472 + auVar20._0_4_;
      fVar16 = fVar12 * -0.6931472 + auVar20._4_4_;
      fVar17 = fVar13 * -0.6931472 + auVar20._8_4_;
      fVar18 = fVar14 * -0.6931472 + auVar20._12_4_;
      auVar20._4_4_ =
           (float)((int)fVar12 * 0x800000 + 0x3f800000) *
           (fVar16 + 1.0 +
           (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
             0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + 1.0;
      auVar20._0_4_ =
           (float)((int)fVar11 * 0x800000 + 0x3f800000) *
           (fVar15 + 1.0 +
           (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
             0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15) + 1.0;
      auVar20._8_4_ =
           (float)((int)fVar13 * 0x800000 + 0x3f800000) *
           (fVar17 + 1.0 +
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17) + 1.0;
      auVar20._12_4_ =
           (float)((int)fVar14 * 0x800000 + 0x3f800000) *
           (fVar18 + 1.0 +
           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
             0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + 1.0;
      auVar20 = divps(_DAT_00539130,auVar20);
      *pfVar5 = auVar20._0_4_ + -1.0;
      pfVar5[1] = auVar20._4_4_ + -1.0;
      pfVar5[2] = auVar20._8_4_ + -1.0;
      pfVar5[3] = auVar20._12_4_ + -1.0;
      pfVar5 = pfVar5 + 4;
      lVar8 = lVar8 + 4;
    }
    lVar4 = sVar3 * sVar2 * uVar10;
    for (; (int)lVar8 < iVar6; lVar8 = lVar8 + 1) {
      fVar11 = tanhf(*(float *)((long)pvVar1 + lVar8 * 4 + lVar4));
      *(float *)((long)pvVar1 + lVar8 * 4 + lVar4) = fVar11;
    }
  }
  return 0;
}

Assistant:

int TanH_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}